

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void setup_frame_size(AV1_COMMON *cm,int frame_size_override_flag,aom_read_bit_buffer *rb)

{
  SequenceHeader *pSVar1;
  undefined8 in_RAX;
  int height;
  int width;
  
  pSVar1 = cm->seq_params;
  if (frame_size_override_flag == 0) {
    _height = CONCAT44(pSVar1->max_frame_width,pSVar1->max_frame_height);
  }
  else {
    _height = in_RAX;
    read_frame_size(rb,pSVar1->num_bits_width,pSVar1->num_bits_height,&width,&height);
    if ((pSVar1->max_frame_width < width) || (pSVar1->max_frame_height < height)) {
      aom_internal_error(cm->error,AOM_CODEC_CORRUPT_FRAME,
                         "Frame dimensions are larger than the maximum values");
    }
  }
  setup_superres(cm,rb,&width,&height);
  resize_context_buffers(cm,width,height);
  setup_render_size(cm,rb);
  setup_buffer_pool(cm);
  return;
}

Assistant:

static inline void setup_frame_size(AV1_COMMON *cm,
                                    int frame_size_override_flag,
                                    struct aom_read_bit_buffer *rb) {
  const SequenceHeader *const seq_params = cm->seq_params;
  int width, height;

  if (frame_size_override_flag) {
    int num_bits_width = seq_params->num_bits_width;
    int num_bits_height = seq_params->num_bits_height;
    read_frame_size(rb, num_bits_width, num_bits_height, &width, &height);
    if (width > seq_params->max_frame_width ||
        height > seq_params->max_frame_height) {
      aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                         "Frame dimensions are larger than the maximum values");
    }
  } else {
    width = seq_params->max_frame_width;
    height = seq_params->max_frame_height;
  }

  setup_superres(cm, rb, &width, &height);
  resize_context_buffers(cm, width, height);
  setup_render_size(cm, rb);
  setup_buffer_pool(cm);
}